

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

CollectionItrPair * __thiscall
Jinx::Variant::GetCollectionItr(CollectionItrPair *__return_storage_ptr__,Variant *this)

{
  bool bVar1;
  Variant v;
  
  if (this->m_type == CollectionItr) {
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
            *)&(this->field_1).m_string);
  }
  else {
    Copy(&v,this);
    bVar1 = ConvertTo(&v,CollectionItr);
    if (bVar1) {
      GetCollectionItr(__return_storage_ptr__,&v);
    }
    else {
      (__return_storage_ptr__->first)._M_node = (_Base_ptr)0x0;
      (__return_storage_ptr__->second).
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->second).
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    Destroy(&v);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t CollectionItrPair Variant::GetCollectionItr() const
	{
		if (IsCollectionItr())
			return m_collectionItrPair;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::CollectionItr))
			return CollectionItrPair();
		return v.GetCollectionItr();
	}